

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nxx.cpp
# Opt level: O2

bool mg::data::nxgx_decompress(Nxx *header,uint8_t *data,string *out)

{
  int iVar1;
  uint uVar2;
  uint8_t *local_90;
  ulong local_88;
  undefined8 uStack_80;
  pointer local_78;
  ulong uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  std::__cxx11::string::resize((ulong)out);
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_28 = 0;
  uStack_80 = 0;
  local_88 = (ulong)header->compressed_size;
  uStack_70 = (ulong)header->size;
  local_78 = (out->_M_dataplus)._M_p;
  local_90 = data;
  iVar1 = inflateInit2_(&local_90,0x1f,"1.2.11",0x70);
  uVar2 = 1;
  if (((iVar1 == 0) && (uVar2 = inflate(&local_90,2), uVar2 < 2)) &&
     (iVar1 = inflateEnd(&local_90), uVar2 = 1, iVar1 == 0)) {
    return true;
  }
  fprintf(_stderr,"zlib error: %d: %s\n",uVar2,uStack_60);
  return false;
}

Assistant:

bool nxgx_decompress(const Nxx &header, const uint8_t *data, std::string &out) {
  // Expand output to hold data
  out.resize(header.size);

  // Create inflate stream
  z_stream istream{};
  istream.avail_in = header.compressed_size;
  istream.next_in = const_cast<uint8_t *>(data);
  istream.avail_out = header.size;
  istream.next_out = reinterpret_cast<uint8_t *>(out.data());
  istream.total_out = 0;

  // Init inflate context
  if (int err = inflateInit2(&istream, 16 + MAX_WBITS) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  // Perform inflation
  const int err = inflate(&istream, Z_SYNC_FLUSH);
  if (err != Z_OK && err != Z_STREAM_END) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  if (int err = inflateEnd(&istream) != Z_OK) {
    fprintf(stderr, "zlib error: %d: %s\n", err, istream.msg);
    return false;
  }

  return true;
}